

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_shrinkCI(lua_State *L)

{
  CallInfo *block;
  CallInfo *pCVar1;
  CallInfo *next2;
  CallInfo *next;
  CallInfo *ci;
  lua_State *L_local;
  
  next = L->ci->next;
  if (next != (CallInfo *)0x0) {
    while (block = next->next, block != (CallInfo *)0x0) {
      pCVar1 = block->next;
      next->next = pCVar1;
      L->nci = L->nci - 1;
      luaM_free_(L,block,0x40);
      if (pCVar1 == (CallInfo *)0x0) {
        return;
      }
      pCVar1->previous = next;
      next = pCVar1;
    }
  }
  return;
}

Assistant:

void luaE_shrinkCI (lua_State *L) {
  CallInfo *ci = L->ci->next;  /* first free CallInfo */
  CallInfo *next;
  if (ci == NULL)
    return;  /* no extra elements */
  while ((next = ci->next) != NULL) {  /* two extra elements? */
    CallInfo *next2 = next->next;  /* next's next */
    ci->next = next2;  /* remove next from the list */
    L->nci--;
    luaM_free(L, next);  /* free next */
    if (next2 == NULL)
      break;  /* no more elements */
    else {
      next2->previous = ci;
      ci = next2;  /* continue */
    }
  }
}